

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O3

int lj_ffh_string_sub(lua_State *L)

{
  TValue *pTVar1;
  int32_t iVar2;
  double dVar3;
  
  lj_lib_checkstr(L,1);
  lj_lib_checkint(L,2);
  pTVar1 = L->base + 2;
  dVar3 = -1.0;
  if ((pTVar1 < L->top) && (*(int *)((long)L->base + 0x14) != -1)) {
    iVar2 = lj_lib_checkint(L,3);
    dVar3 = (double)iVar2;
  }
  pTVar1->u64 = (uint64_t)dVar3;
  return 0;
}

Assistant:

LJLIB_ASM(string_sub)		LJLIB_REC(string_range 1)
{
  lj_lib_checkstr(L, 1);
  lj_lib_checkint(L, 2);
  setintV(L->base+2, lj_lib_optint(L, 3, -1));
  return FFH_RETRY;
}